

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  double dVar1;
  ostream *poVar2;
  long lVar3;
  double *pdVar4;
  TransferFunction<double> *pTVar5;
  pointer pdVar6;
  byte bVar7;
  initializer_list<double> __l;
  Polynomial<double> p1;
  vector<double,_std::allocator<double>_> aMa;
  vector<double,_std::allocator<double>_> bMa;
  Polynomial<double> p2;
  Filter<double> filterLowPass2nd;
  Polynomial<double> p3;
  Polynomial<double> p4;
  ofstream outF;
  StateSpaceFilter<double> ssFilter;
  vector<double,_std::allocator<double>_> times;
  Filter<double> emptyFilter;
  Filter<double> filterLowPass6th;
  TransferFunction<double> tf;
  TransferFunction<double> lowPass6th;
  Filter<double> maFilter;
  Polynomial<double> local_810;
  vector<double,_std::allocator<double>_> local_7e8;
  vector<double,_std::allocator<double>_> local_7c8;
  Polynomial<double> local_7b0;
  Filter<double> local_788;
  double local_6e0;
  Polynomial<double> local_6d8;
  Polynomial<double> local_6b0;
  TransferFunction<double> local_688 [5];
  StateSpaceFilter<double> local_480;
  vector<double,_std::allocator<double>_> local_460;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  Polynomial<double> local_368;
  Polynomial<double> local_340;
  Filter<double> local_318;
  Filter<double> local_278;
  TransferFunction<double> local_1d8;
  TransferFunction<double> local_180;
  TransferFunction<double> local_128;
  Filter<double> local_d0;
  
  bVar7 = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"|        TEST #1         |",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"|       Polynomial       |",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  local_688[0].samplingFrequency_ = (double)&local_788;
  local_788.tf_.samplingFrequency_ = 1.0;
  local_788.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4000000000000000;
  local_688[0].numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  rtb::Filter::Polynomial<double>::Polynomial(&local_810,(initializer_list<double> *)local_688);
  local_688[0].samplingFrequency_ = 1.0;
  local_688[0].numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc000000000000000;
  local_688[0].numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_788.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_788.tf_.samplingFrequency_ = (double)local_688;
  rtb::Filter::Polynomial<double>::Polynomial(&local_7b0,(initializer_list<double> *)&local_788);
  local_688[0].numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x4008000000000000;
  local_688[0].numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4010000000000000;
  local_688[0].samplingFrequency_ = 0.0;
  local_688[0].numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4000000000000000;
  local_788.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4;
  local_788.tf_.samplingFrequency_ = (double)local_688;
  rtb::Filter::Polynomial<double>::Polynomial(&local_6d8,(initializer_list<double> *)&local_788);
  local_788.tf_.samplingFrequency_ = 5.0;
  local_688[0].numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_688[0].samplingFrequency_ = (double)&local_788;
  rtb::Filter::Polynomial<double>::Polynomial(&local_6b0,(initializer_list<double> *)local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p1 =",4);
  rtb::Filter::operator<<((ostream *)&std::cout,&local_810);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p2 =",4);
  rtb::Filter::operator<<((ostream *)&std::cout,&local_7b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p3 =",4);
  rtb::Filter::operator<<((ostream *)&std::cout,&local_6d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p4 =",4);
  rtb::Filter::operator<<((ostream *)&std::cout,&local_6b0);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Scalar Multiplication",0x15);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p1 * 2 = ",9);
  local_318.tf_.samplingFrequency_ = 2.0;
  local_278.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_278.tf_.samplingFrequency_ = (double)&local_318;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&local_788,(initializer_list<double> *)&local_278);
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)local_688,&local_810,(Polynomial<double> *)&local_788);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  if ((void *)local_788.tf_.samplingFrequency_ != (void *)0x0) {
    operator_delete((void *)local_788.tf_.samplingFrequency_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p2 * 3 = ",9);
  local_318.tf_.samplingFrequency_ = 3.0;
  local_278.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_278.tf_.samplingFrequency_ = (double)&local_318;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&local_788,(initializer_list<double> *)&local_278);
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)local_688,&local_7b0,(Polynomial<double> *)&local_788);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  if ((void *)local_788.tf_.samplingFrequency_ != (void *)0x0) {
    operator_delete((void *)local_788.tf_.samplingFrequency_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p3 * 4 = ",9);
  local_318.tf_.samplingFrequency_ = 4.0;
  local_278.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_278.tf_.samplingFrequency_ = (double)&local_318;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&local_788,(initializer_list<double> *)&local_278);
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)local_688,&local_6d8,(Polynomial<double> *)&local_788);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  if ((void *)local_788.tf_.samplingFrequency_ != (void *)0x0) {
    operator_delete((void *)local_788.tf_.samplingFrequency_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p4 * 5 = ",9);
  local_318.tf_.samplingFrequency_ = 5.0;
  local_278.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_278.tf_.samplingFrequency_ = (double)&local_318;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&local_788,(initializer_list<double> *)&local_278);
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)local_688,&local_6b0,(Polynomial<double> *)&local_788);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  if ((void *)local_788.tf_.samplingFrequency_ != (void *)0x0) {
    operator_delete((void *)local_788.tf_.samplingFrequency_);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Complex Multiplication",0x16);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p1 * (2 + 2i) = ",0x10);
  local_318.tf_.samplingFrequency_ = 2.0;
  local_318.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4000000000000000;
  local_278.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_278.tf_.samplingFrequency_ = (double)&local_318;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&local_788,(initializer_list<std::complex<double>_> *)&local_278)
  ;
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)local_688,&local_810,(Polynomial<double> *)&local_788);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  if ((void *)local_788.tf_.samplingFrequency_ != (void *)0x0) {
    operator_delete((void *)local_788.tf_.samplingFrequency_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p2 * (3 - 3i) = ",0x10);
  local_318.tf_.samplingFrequency_ = 3.0;
  local_318.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc008000000000000;
  local_278.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_278.tf_.samplingFrequency_ = (double)&local_318;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&local_788,(initializer_list<std::complex<double>_> *)&local_278)
  ;
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)local_688,&local_7b0,(Polynomial<double> *)&local_788);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  if ((void *)local_788.tf_.samplingFrequency_ != (void *)0x0) {
    operator_delete((void *)local_788.tf_.samplingFrequency_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p3 * (4 + 4i) = ",0x10);
  local_318.tf_.samplingFrequency_ = 4.0;
  local_318.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4010000000000000;
  local_278.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_278.tf_.samplingFrequency_ = (double)&local_318;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&local_788,(initializer_list<std::complex<double>_> *)&local_278)
  ;
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)local_688,&local_6d8,(Polynomial<double> *)&local_788);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  if ((void *)local_788.tf_.samplingFrequency_ != (void *)0x0) {
    operator_delete((void *)local_788.tf_.samplingFrequency_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p4 * (5 - 5i) = ",0x10);
  local_318.tf_.samplingFrequency_ = 5.0;
  local_318.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xc014000000000000;
  local_278.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_278.tf_.samplingFrequency_ = (double)&local_318;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&local_788,(initializer_list<std::complex<double>_> *)&local_278)
  ;
  rtb::Filter::multiply<double>
            ((Polynomial<double> *)local_688,&local_6b0,(Polynomial<double> *)&local_788);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  if ((void *)local_788.tf_.samplingFrequency_ != (void *)0x0) {
    operator_delete((void *)local_788.tf_.samplingFrequency_);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Polynomial Multiplication",0x19);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p1 * p1 = ",10);
  rtb::Filter::multiply<double>((Polynomial<double> *)local_688,&local_810,&local_810);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p2 * p1 = ",10);
  rtb::Filter::multiply<double>((Polynomial<double> *)local_688,&local_7b0,&local_810);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p3 * p1 = ",10);
  rtb::Filter::multiply<double>((Polynomial<double> *)local_688,&local_6d8,&local_810);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p4 * p1 = ",10);
  rtb::Filter::multiply<double>((Polynomial<double> *)local_688,&local_6b0,&local_810);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Polynomial Addition",0x13);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p1 + p1 = ",10);
  rtb::Filter::add<double>((Polynomial<double> *)local_688,&local_810,&local_810);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p2 + p1 = ",10);
  rtb::Filter::add<double>((Polynomial<double> *)local_688,&local_7b0,&local_810);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p3 + p1 = ",10);
  rtb::Filter::add<double>((Polynomial<double> *)local_688,&local_6d8,&local_810);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"p4 + p1 = ",10);
  rtb::Filter::add<double>((Polynomial<double> *)local_688,&local_6b0,&local_810);
  poVar2 = rtb::Filter::operator<<((ostream *)&std::cout,(Polynomial<double> *)local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  if ((Filter<double> *)local_688[0].samplingFrequency_ != (Filter<double> *)0x0) {
    operator_delete((void *)local_688[0].samplingFrequency_);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"|        TEST #2         |",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"|    TransferFunction    |",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Coefficients are normalised to the denominator",0x2e);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Pole-zero simplifications are NOT implemented",0x2d);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TF = p1/p2 ",0xb);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  rtb::Filter::TransferFunction<double>::TransferFunction(local_688,&local_810,&local_7b0);
  poVar2 = rtb::Filter::operator<<(poVar2,local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::~TransferFunction(local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TF = p2/p2 ",0xb);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  rtb::Filter::TransferFunction<double>::TransferFunction(local_688,&local_7b0,&local_7b0);
  poVar2 = rtb::Filter::operator<<(poVar2,local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::~TransferFunction(local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TF = p3/p2 ",0xb);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  rtb::Filter::TransferFunction<double>::TransferFunction(local_688,&local_6d8,&local_7b0);
  poVar2 = rtb::Filter::operator<<(poVar2,local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::~TransferFunction(local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TF = p4/p3 ",0xb);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  rtb::Filter::TransferFunction<double>::TransferFunction(local_688,&local_6b0,&local_6d8);
  poVar2 = rtb::Filter::operator<<(poVar2,local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::~TransferFunction(local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TF = p3/p4 ",0xb);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  rtb::Filter::TransferFunction<double>::TransferFunction(local_688,&local_6d8,&local_6b0);
  poVar2 = rtb::Filter::operator<<(poVar2,local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::~TransferFunction(local_688);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TF = (1+2i)/p2 ",0xf);
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_318.tf_.samplingFrequency_ = 1.0;
  local_318.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4000000000000000;
  local_278.tf_.numerator_.coefficients_.
  super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_278.tf_.samplingFrequency_ = (double)&local_318;
  rtb::Filter::Polynomial<double>::Polynomial
            ((Polynomial<double> *)&local_788,(initializer_list<std::complex<double>_> *)&local_278)
  ;
  rtb::Filter::TransferFunction<double>::TransferFunction
            (local_688,(Polynomial<double> *)&local_788,&local_7b0);
  poVar2 = rtb::Filter::operator<<(poVar2,local_688);
  std::endl<char,std::char_traits<char>>(poVar2);
  rtb::Filter::TransferFunction<double>::~TransferFunction(local_688);
  if ((void *)local_788.tf_.samplingFrequency_ != (void *)0x0) {
    operator_delete((void *)local_788.tf_.samplingFrequency_);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"|        TEST #3         |",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"|    Filter Designer     |",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz"
             ,0x59);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  rtb::Filter::butter2ndOrder<double>(&local_1d8,0.018851788690786585);
  local_1d8.samplingFrequency_ = 1000.0;
  rtb::Filter::operator<<((ostream *)&std::cout,&local_1d8);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"lowPass2nd_bode.csv","");
  bodeDiagram<double>(&local_1d8,&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "IIR Filter, 6th Order Low Pass Butterworth, cutoff frequency 300Hz, sample frequency 1000Hz"
             ,0x5b);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  rtb::Filter::butter<double>(&local_180,6,300.0,1000.0);
  rtb::Filter::operator<<((ostream *)&std::cout,&local_180);
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"lowPass6th_bode.csv","");
  bodeDiagram<double>(&local_180,&local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"|        TEST #4         |",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"|     Step Response      |",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz"
             ,0x59);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  rtb::Filter::Filter<double>::Filter(&local_788,&local_1d8);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"lowPass2nd_step.csv","");
  stepResponse<double>(&local_788,&local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "IIR Filter, 6th Order Low Pass Butterworth, cutoff frequency 300Hz, sample frequency 1000Hz"
             ,0x5b);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  rtb::Filter::Filter<double>::Filter(&local_278,&local_180);
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"lowPass6th_step.csv","");
  stepResponse<double>(&local_278,&local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_480.lastTime_ = INFINITY;
  local_480.lastValue_ = 0.0;
  local_480.lastFirstDerivative_ = 0.0;
  local_480.lastSecondDerivative_ = 0.0;
  pdVar4 = (double *)&DAT_00108790;
  pTVar5 = local_688;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    pTVar5->samplingFrequency_ = *pdVar4;
    pdVar4 = pdVar4 + (ulong)bVar7 * -2 + 1;
    pTVar5 = (TransferFunction<double> *)((long)pTVar5 + ((ulong)bVar7 * -2 + 1) * 8);
  }
  __l._M_len = 0xc;
  __l._M_array = &local_688[0].samplingFrequency_;
  std::vector<double,_std::allocator<double>_>::vector(&local_460,__l,(allocator_type *)&local_318);
  std::ofstream::ofstream(local_688,"stateSpaceFilter_300_step.csv",_S_out);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Printing step response to stateSpaceFilter_300_step.csv",0x37);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  dVar1 = rtb::Filter::StateSpaceFilter<double>::filter(&local_480,0.0,0.0,300.0);
  poVar2 = std::ostream::_M_insert<double>(dVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  if (local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pdVar6 = local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_6e0 = *pdVar6;
      poVar2 = std::ostream::_M_insert<double>(local_6e0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      poVar2 = std::ostream::_M_insert<double>(1.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      dVar1 = rtb::Filter::StateSpaceFilter<double>::filter(&local_480,1.0,local_6e0,300.0);
      poVar2 = std::ostream::_M_insert<double>(dVar1);
      std::endl<char,std::char_traits<char>>(poVar2);
      pdVar6 = pdVar6 + 1;
    } while (pdVar6 != local_460.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::ofstream::close();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"|        TEST #5         |",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"|Filter def. constructor |",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--------------------------",0x1a);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  rtb::Filter::Filter<double>::Filter(&local_318);
  rtb::Filter::Filter<double>::setTransferFunction(&local_318,&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Late initialization. IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz"
             ,0x6e);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_408,"lowPass2nd_step_lateInit.csv","");
  stepResponse<double>(&local_318,&local_408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Step response for state space filter with f0=8Hz",0x30);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"ssfilter8Hz_step.csv","");
  stepResponse<double>(&local_480,8.0,&local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Step response for moving average filter",0x27);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  local_7c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_7c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_7c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_7c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0xa0);
  local_7c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_7c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 0x14;
  lVar3 = 0;
  do {
    local_7c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar3] = 0.05;
    (local_7c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start + lVar3)[1] = 0.05;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 0x14);
  local_7e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_7e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_7e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_7c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_7c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  local_7e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(8);
  local_7e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_7e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
  *local_7e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 1.0;
  local_7e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_7e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  rtb::Filter::Polynomial<double>::Polynomial(&local_340,&local_7c8);
  rtb::Filter::Polynomial<double>::Polynomial(&local_368,&local_7e8);
  rtb::Filter::TransferFunction<double>::TransferFunction(&local_128,&local_340,&local_368);
  rtb::Filter::Filter<double>::Filter(&local_d0,&local_128);
  rtb::Filter::TransferFunction<double>::~TransferFunction(&local_128);
  if (local_368.coefficients_.
      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368.coefficients_.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_340.coefficients_.
      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_340.coefficients_.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_448,"moving_avg_filter_step.csv","");
  stepResponse<double>(&local_d0,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  exit(0);
}

Assistant:

int main() {

    typedef std::complex<double> Complex;
    cout << "--------------------------" << endl;
    cout << "|        TEST #1         |" << endl;
    cout << "|       Polynomial       |" << endl;
    cout << "--------------------------" << endl;

    Polynomial<double> p1{ 1, 2 };
    Polynomial<double> p2{ 1, -2, 0 };
    Polynomial<double> p3{ 0, 2, 3, 4 };
    Polynomial<double> p4{ 5 };

    cout << "p1 =" << p1;
    cout << "p2 =" << p2;
    cout << "p3 =" << p3;
    cout << "p4 =" << p4;
    cout << endl;
    cout << "Scalar Multiplication" << endl;
    cout << "p1 * 2 = " << multiply<double>(p1, { 2 }) << endl;
    cout << "p2 * 3 = " << multiply<double>(p2, { 3 }) << endl;
    cout << "p3 * 4 = " << multiply<double>(p3, { 4 }) << endl;
    cout << "p4 * 5 = " << multiply<double>(p4, { 5 }) << endl;
    cout << endl;
    cout << "Complex Multiplication" << endl;
    cout << "p1 * (2 + 2i) = " << multiply<double>(p1, { Complex(2, 2) }) << endl;
    cout << "p2 * (3 - 3i) = " << multiply<double>(p2, { Complex(3, -3) }) << endl;
    cout << "p3 * (4 + 4i) = " << multiply<double>(p3, { Complex(4, 4) }) << endl;
    cout << "p4 * (5 - 5i) = " << multiply<double>(p4, { Complex(5, -5) }) << endl;
    cout << endl;
    cout << "Polynomial Multiplication" << endl;
    cout << "p1 * p1 = " << p1*p1 << endl;
    cout << "p2 * p1 = " << p2*p1 << endl;
    cout << "p3 * p1 = " << p3*p1 << endl;
    cout << "p4 * p1 = " << p4*p1 << endl;
    cout << endl;
    cout << "Polynomial Addition" << endl;
    cout << "p1 + p1 = " << add<double>(p1, p1) << endl;
    cout << "p2 + p1 = " << add<double>(p2, p1) << endl;
    cout << "p3 + p1 = " << add<double>(p3, p1) << endl;
    cout << "p4 + p1 = " << add<double>(p4, p1) << endl;
    cout << endl;

    cout << "--------------------------" << endl;
    cout << "|        TEST #2         |" << endl;
    cout << "|    TransferFunction    |" << endl;
    cout << "--------------------------" << endl;
    cout << "Coefficients are normalised to the denominator" << endl;
    cout << "Pole-zero simplifications are NOT implemented" << endl;
    cout << "TF = p1/p2 " << endl << TransferFunction<double>(p1, p2) << endl;
    cout << "TF = p2/p2 " << endl << TransferFunction<double>(p2, p2) << endl;
    cout << "TF = p3/p2 " << endl << TransferFunction<double>(p3, p2) << endl;
    cout << "TF = p4/p3 " << endl << TransferFunction<double>(p4, p3) << endl;
    cout << "TF = p3/p4 " << endl << TransferFunction<double>(p3, p4) << endl;
    cout << "TF = (1+2i)/p2 " << endl << TransferFunction<double>({ { 1, 2 } }, p2) << endl;
    cout << endl;

    cout << "--------------------------" << endl;
    cout << "|        TEST #3         |" << endl;
    cout << "|    Filter Designer     |" << endl;
    cout << "--------------------------" << endl;
    cout << "IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz" << endl;
    TransferFunction<double> lowPass2nd(butter<double>(2, 6, 1000));
    cout << lowPass2nd;
    bodeDiagram(lowPass2nd, "lowPass2nd_bode.csv");
    cout << endl;

    cout << "IIR Filter, 6th Order Low Pass Butterworth, cutoff frequency 300Hz, sample frequency 1000Hz" << endl;
    TransferFunction<double> lowPass6th(butter<double>(6, 300, 1000));
    cout << lowPass6th;
    bodeDiagram(lowPass6th, "lowPass6th_bode.csv");
    cout << endl;

    cout << "--------------------------" << endl;
    cout << "|        TEST #4         |" << endl;
    cout << "|     Step Response      |" << endl;
    cout << "--------------------------" << endl;

    cout << "IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz" << endl;
    Filter<double> filterLowPass2nd(lowPass2nd);
    stepResponse<double>(filterLowPass2nd, "lowPass2nd_step.csv");
    cout << endl;
    cout << "IIR Filter, 6th Order Low Pass Butterworth, cutoff frequency 300Hz, sample frequency 1000Hz" << endl;
    Filter<double> filterLowPass6th(lowPass6th);
    stepResponse<double>(filterLowPass6th, "lowPass6th_step.csv");
    cout << endl;

    StateSpaceFilter<double> ssFilter;
    std::vector<double> times = { 0.01, 0.02, 0.032, 0.038, 0.05, 0.063, 0.07, 0.09, 0.102, 0.11, 0.119, 0.14 };
    std::ofstream outF("stateSpaceFilter_300_step.csv");
    cout << "Printing step response to stateSpaceFilter_300_step.csv" << endl;
    outF << 0.0 << ", " << 0.0 << ", " << ssFilter.filter(0.0, 0.0, 300) << std::endl;
    for (auto t : times)
        outF << t << ", " << 1.0 << ", " << ssFilter.filter(1.0, t, 300) << std::endl;
    outF.close();

    cout << "--------------------------" << endl;
    cout << "|        TEST #5         |" << endl;
    cout << "|Filter def. constructor |" << endl;
    cout << "--------------------------" << endl;

    Filter<double> emptyFilter;
    emptyFilter.setTransferFunction(lowPass2nd);
    cout << "Late initialization. IIR Filter, 2nd Order Low Pass Butterworth, cutoff frequency 6Hz, sample frequency 1000Hz" << endl;
    stepResponse<double>(emptyFilter, "lowPass2nd_step_lateInit.csv");

    cout << "Step response for state space filter with f0=8Hz" << endl;
    StateSpaceFilter<double> ssfiler;
    stepResponse<double>(ssFilter, 8, "ssfilter8Hz_step.csv");

    cout << "Step response for moving average filter" << endl;
    std::vector<double> bMa(20, 1. / 20.);
    std::vector<double> aMa(1, 1.);

    Filter<double> maFilter(TransferFunction<>(bMa, aMa));
    stepResponse<double>(maFilter, "moving_avg_filter_step.csv");

    /*
    std::cout << "p1 = " << p1;
    std::cout << "p1(3) = " << p1.solveFor(-1) << std::endl;

    //step response
    std::vector<double> zeroes(1, 0.0);
    std::vector<double> ones(1000, 1.0);
    std::vector<double> step(zeroes);
    step.insert(step.end(), ones.begin(), ones.end());

    TransferFunction<double> tfDesigned(Designer::butter2ndOrder<double>(6, 1000.));

    std::cout << "Designed filter\n";
    std::cout << tfDesigned.getSamplingFrequency() << std::endl;
    Filter<double> filter(tfDesigned);

    Filter<double> filter4th(Designer::butter<double>(4, 6, 1000));

    //std::cout << filter;
    //std::cout << filter4th;
    //      std::cout << filterDouble;

    /*
    std::ofstream oF("output.csv");
    for (double val : step)
    oF << val << "," << std::abs(filter.filter(val)) << "," << std::abs(filter4th.filter(val)) << std::endl;
    oF.close();

    std::ofstream oFBode("bode_gain.csv");
    std::vector<double> xValues, gain, phase;
    tfDesigned.getBode(xValues, gain, phase);
    for (unsigned i{ 0 }; i < xValues.size(); ++i)
    oFBode << xValues.at(i) << "," << gain.at(i) << "," << phase.at(i) << std::endl;
    oFBode.close();
    /*
    std::ofstream oFBodePhase("bode_phase.csv");
    for (unsigned i{ 1 }; i < 1000; ++i)
    oFBodePhase << M_PI / 1000 * i << "," << tfDesigned.getPhaseAt(M_PI / 1000 * i) << std::endl;
    oFBodePhase.close();

    /*

    //test filtfilt
    vector<double> firstPass(filter.pass(step));
    std::reverse(firstPass.begin(), firstPass.end());
    vector<double> secondPass(filter.pass(firstPass));
    std::reverse(secondPass.begin(), secondPass.end());

    std::reverse(firstPass.begin(), firstPass.end());

    std::ofstream oF2("filtfilt.csv");
    for (unsigned i{ 0 }; i < step.size(); ++i)
    oF2 << step.at(i) << "," << firstPass.at(i) << "," << secondPass.at(i) << std::endl;
    oF2.close();

    /*

    //test linear phase fir filter
    std::vector<double> firB( {
    0.00127199776427371,
    0.00175973248875467,
    -0.000474050123699974,
    -0.00507655778150986,
    -0.00730622779100510,
    -0.00139834985893385,
    0.0118182305510141,
    0.0208600394665444,
    0.0108509633977398,
    -0.0201948738097724,
    -0.0503421398292688,
    -0.0426075899832280,
    0.0273002961309331,
    0.144919701151270,
    0.257048286517307,
    0.303233271924363,
    0.257048286517307,
    0.144919701151270,
    0.0273002961309331,
    -0.0426075899832280,
    -0.0503421398292688,
    -0.0201948738097724,
    0.0108509633977398,
    0.0208600394665444,
    0.0118182305510141,
    -0.00139834985893385,
    -0.00730622779100510,
    -0.00507655778150986,
    -0.000474050123699974,
    0.00175973248875467,
    0.00127199776427371
    } );

    Polynomial<> n(firB), d{ 1 };

    TransferFunction<> tfFir(n, d);
    Filter<> firFilter(tfFir);
    vector<double> resultFir(firFilter.pass(step));

    std::ofstream oF3("comparison.csv");
    for (unsigned i{ 0 }; i < step.size(); ++i)
    oF3 << step.at(i) << "," << firstPass.at(i) << "," << secondPass.at(i) << ", " << resultFir.at(i) << std::endl;
    oF3.close();

    */
    //      TransferFunction<double> h1(p1, p2);

    //std::cout << add(p, Polynomial<double>(std::vector<double>{ 1, 2, 3, 4 }));

    std::exit(EXIT_SUCCESS);
}